

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O2

void visit_list_expr(gvisitor_t *self,gnode_list_expr_t *node)

{
  ulong uVar1;
  _Bool _Var2;
  long *plVar3;
  ircode_t *code;
  _Bool _Var4;
  uint32_t p1;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  long lVar8;
  ulong uVar9;
  uint p2;
  char *format;
  uint uVar10;
  size_t j;
  ulong uVar11;
  gnode_t *node_00;
  uint32_t p2_00;
  long local_50;
  
  plVar3 = *(long **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
  if ((plVar3 == (long *)0x0) || ((gravity_class_t *)*plVar3 != gravity_class_function)) {
    report_error(self,&node->base,"Invalid code context.");
    return;
  }
  code = (ircode_t *)plVar3[0x14];
  _Var2 = node->ismap;
  if (node->list1 == (gnode_r *)0x0) {
    p2_00 = 0;
  }
  else {
    p2_00 = (uint32_t)node->list1->n;
  }
  p1 = ircode_register_push_temp(code);
  ircode_add(code,LISTNEW - _Var2,p1,p2_00,0,(node->base).token.lineno);
  if (p2_00 == 0) {
    return;
  }
  uVar5 = (uint)(_Var2 ^ 1) * 0x40 + 0x40;
  ircode_pragma(code,PRAGMA_MOVE_OPTIMIZATION,0,(node->base).token.lineno);
  uVar10 = 0;
  do {
    p2 = p2_00 - uVar10;
    if (p2_00 < uVar10 || p2 == 0) {
      ircode_pragma(code,PRAGMA_MOVE_OPTIMIZATION,1,(node->base).token.lineno);
      return;
    }
    if (uVar5 <= p2) {
      p2 = uVar5;
    }
    uVar11 = (ulong)uVar10;
    uVar1 = p2 + uVar11;
    ircode_push_context(code);
    local_50 = 1;
    for (; uVar11 < uVar1; uVar11 = uVar11 + 1) {
      if (uVar11 < node->list1->n) {
        node_00 = node->list1->p[uVar11];
      }
      else {
        node_00 = (gnode_t *)0x0;
      }
      gvisit(self,node_00);
      uVar6 = ircode_register_pop_context_protect(code,true);
      if ((uVar6 == 0xffffffff) ||
         ((uVar6 <= p1 && (_Var4 = ircode_register_istemp(code,uVar6), _Var4)))) {
        format = "Invalid list expression.";
LAB_001389e6:
        report_error(self,node_00,format);
      }
      else {
        uVar9 = (ulong)p1 + local_50;
        if (uVar9 == uVar6) {
LAB_00138a62:
          lVar8 = 1;
          if (_Var2 != false) {
            if (uVar11 < node->list2->n) {
              node_00 = node->list2->p[uVar11];
            }
            else {
              node_00 = (gnode_t *)0x0;
            }
            ircode_pragma(code,PRAGMA_MOVE_OPTIMIZATION,1,(node->base).token.lineno);
            gvisit(self,node_00);
            ircode_pragma(code,PRAGMA_MOVE_OPTIMIZATION,0,(node->base).token.lineno);
            uVar6 = ircode_register_pop_context_protect(code,true);
            if ((uVar6 == 0xffffffff) ||
               ((uVar6 <= p1 && (_Var4 = ircode_register_istemp(code,uVar6), _Var4)))) {
              format = "Invalid map expression.";
              goto LAB_001389e6;
            }
            lVar8 = 2;
            if (uVar9 + 1 != (ulong)uVar6) {
              uVar7 = ircode_register_push_temp(code);
              ircode_add(code,MOVE,uVar7,uVar6,0,(node->base).token.lineno);
              ircode_register_clear(code,uVar6);
              uVar6 = ircode_register_pop_context_protect(code,true);
              if (uVar6 == 0xffffffff) goto LAB_00138a98;
              lVar8 = 2;
              if (uVar9 + 1 != (ulong)uVar7) goto LAB_00138b42;
            }
          }
          local_50 = local_50 + lVar8;
        }
        else {
          uVar7 = ircode_register_push_temp(code);
          ircode_add(code,MOVE,uVar7,uVar6,0,(node->base).token.lineno);
          ircode_register_clear(code,uVar6);
          uVar6 = ircode_register_pop_context_protect(code,true);
          if (uVar6 != 0xffffffff) {
            if (uVar9 == uVar7) goto LAB_00138a62;
LAB_00138b42:
            format = "Unexpected register computation.";
            goto LAB_001389e6;
          }
LAB_00138a98:
          report_error(self,node_00,"Unexpected register error.");
        }
      }
    }
    uVar10 = uVar10 + p2;
    ircode_add(code,SETLIST,p1,p2,0,(node->base).token.lineno);
    ircode_pop_context(code);
  } while( true );
}

Assistant:

static void visit_list_expr (gvisitor_t *self, gnode_list_expr_t *node) {
    DEBUG_CODEGEN("visit_list_expr");
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    bool     ismap = node->ismap;
    uint32_t n = (uint32_t)gnode_array_size(node->list1);

    // a map requires twice registers than a list
    uint32_t max_fields = (ismap) ? MAX_FIELDSxFLUSH : MAX_FIELDSxFLUSH*2;

    // destination register of a new instruction is ALWAYS a temp register
    // then the optimizer could decide to optimize and merge the step
    uint32_t dest = ircode_register_push_temp(code);
	ircode_add(code, (ismap) ? MAPNEW : LISTNEW, dest, n, 0, LINE_NUMBER(node));
    if (n == 0) return;

    // this is just like Lua "fields per flush"
    // basically nodes are processed in a finite chunk
    // and then added to the list/map
    uint32_t nloops = n / max_fields;
    if (n % max_fields != 0) ++nloops;
    uint32_t nprocessed = 0;

	ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));
    while (nprocessed < n) {
        size_t k = (n - nprocessed > max_fields) ? max_fields : (n - nprocessed);
        size_t idxstart = nprocessed;
        size_t idxend = nprocessed + k;
        nprocessed += (uint32_t)k;

        // check if this chunk can be optimized
        // if (check_literals_list(self, node, ismap, idxstart, idxend, dest)) continue;

        // save register context
        ircode_push_context(code);

        // process each node
        for (size_t i=1, j=idxstart; j<idxend; ++j) {
            gnode_t *e = gnode_array_get(node->list1, j);
            visit(e);
            uint32_t nreg = ircode_register_pop_context_protect(code, true);
            if ((nreg == REGISTER_ERROR) || ((nreg <= dest) && (ircode_register_istemp(code, nreg)))) {
                report_error(self, (gnode_t *)e, "Invalid list expression.");
                continue;
            }

            if (nreg != dest + i) {
                uint32_t temp_register = ircode_register_push_temp(code);
				ircode_add(code, MOVE, temp_register, nreg, 0, LINE_NUMBER(node));
                ircode_register_clear(code, nreg);
                uint32_t temp = ircode_register_pop_context_protect(code, true);
                if (temp == REGISTER_ERROR) {report_error(self, (gnode_t *)e, "Unexpected register error."); continue;}
                if (temp_register != dest + i) {report_error(self, (gnode_t *)e, "Unexpected register computation."); continue;}
            }

            if (ismap) {
                e = gnode_array_get(node->list2, j);
				ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
                visit(e);
				ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));
                nreg = ircode_register_pop_context_protect(code, true);
                if ((nreg == REGISTER_ERROR) || ((nreg <= dest) && (ircode_register_istemp(code, nreg)))) {
                    report_error(self, (gnode_t *)e, "Invalid map expression.");
                    continue;
                }

                if (nreg != dest + i + 1) {
                    uint32_t temp_register = ircode_register_push_temp(code);
					ircode_add(code, MOVE, temp_register, nreg, 0, LINE_NUMBER(node));
                    ircode_register_clear(code, nreg);
                    uint32_t temp = ircode_register_pop_context_protect(code, true);
                    if (temp == REGISTER_ERROR) {report_error(self, (gnode_t *)e, "Unexpected register error."); continue;}
                    if (temp_register != dest + i + 1) {report_error(self, (gnode_t *)e, "Unexpected register computation."); continue;}
                }
            }

            i += (ismap) ? 2 : 1;
        }

        // emit proper SETLIST instruction
        // since in a map registers are always used in pairs (key, value) it is
        // extremely easier to just set reg1 to be always 0 and use r in a loop
		ircode_add(code, SETLIST, dest, (uint32_t)(idxend-idxstart), 0, LINE_NUMBER(node));

        // restore register context
        ircode_pop_context(code);
    }

	ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, 1);
}